

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junction.cpp
# Opt level: O0

void __thiscall Junction::findFullDemand(Junction *this,double multiplier,double patternFactor)

{
  double dVar1;
  bool bVar2;
  reference pDVar3;
  undefined1 auStack_58 [8];
  Demand demand;
  _Self local_38;
  iterator __end1;
  iterator __begin1;
  list<Demand,_std::allocator<Demand>_> *__range1;
  double patternFactor_local;
  double multiplier_local;
  Junction *this_local;
  
  (this->super_Node).fullDemand = 0.0;
  __end1 = std::__cxx11::list<Demand,_std::allocator<Demand>_>::begin(&this->demands);
  local_38._M_node =
       (_List_node_base *)std::__cxx11::list<Demand,_std::allocator<Demand>_>::end(&this->demands);
  while( true ) {
    bVar2 = std::operator!=(&__end1,&local_38);
    if (!bVar2) break;
    pDVar3 = std::_List_iterator<Demand>::operator*(&__end1);
    demand.fullDemand = (double)pDVar3->timePattern;
    auStack_58 = (undefined1  [8])pDVar3->baseDemand;
    demand.baseDemand = pDVar3->fullDemand;
    dVar1 = Demand::getFullDemand((Demand *)auStack_58,multiplier,patternFactor);
    (this->super_Node).fullDemand = dVar1 + (this->super_Node).fullDemand;
    Demand::~Demand((Demand *)auStack_58);
    std::_List_iterator<Demand>::operator++(&__end1);
  }
  (this->super_Node).actualDemand = (this->super_Node).fullDemand;
  return;
}

Assistant:

void Junction::findFullDemand(double multiplier, double patternFactor)
{
    fullDemand = 0.0;
    for (Demand demand : demands)
    {
        fullDemand += demand.getFullDemand(multiplier, patternFactor);
    }
    actualDemand = fullDemand;
}